

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenelinearindex_p.h
# Opt level: O2

void __thiscall
QGraphicsSceneLinearIndex::addItem(QGraphicsSceneLinearIndex *this,QGraphicsItem *item)

{
  QList<QGraphicsItem_*>::append((QList<QGraphicsItem_*> *)(this + 0x10),item);
  return;
}

Assistant:

virtual void addItem(QGraphicsItem *item) override
    { m_items << item; }